

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_style_set_cursor(nk_context *ctx,nk_style_cursor c)

{
  nk_style *style;
  nk_style_cursor c_local;
  nk_context *ctx_local;
  
  if (ctx != (nk_context *)0x0) {
    if (ctx == (nk_context *)0x0) {
      ctx_local._4_4_ = 0;
    }
    else if ((ctx->style).cursors[c] == (nk_cursor *)0x0) {
      ctx_local._4_4_ = 0;
    }
    else {
      (ctx->style).cursor_active = (ctx->style).cursors[c];
      ctx_local._4_4_ = 1;
    }
    return ctx_local._4_4_;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x39e5,"int nk_style_set_cursor(struct nk_context *, enum nk_style_cursor)");
}

Assistant:

NK_API int
nk_style_set_cursor(struct nk_context *ctx, enum nk_style_cursor c)
{
    struct nk_style *style;
    NK_ASSERT(ctx);
    if (!ctx) return 0;
    style = &ctx->style;
    if (style->cursors[c]) {
        style->cursor_active = style->cursors[c];
        return 1;
    }
    return 0;
}